

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void repeat(parse *p,sopno start,int from,int to)

{
  long finish;
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t opnd;
  sop op;
  
LAB_00106881:
  if (p->error != 0) {
switchD_001068e7_caseD_9:
    return;
  }
  finish = p->slen;
  uVar1 = from == 0x100 | 2;
  if (from < 2) {
    uVar1 = from;
  }
  uVar2 = to == 0x100 | 2;
  if (to < 2) {
    uVar2 = to;
  }
  iVar3 = uVar2 + uVar1 * 8;
  if (iVar3 == 0x13) {
    start = dupl(p,start,finish);
    from = from - 1;
    goto LAB_00106881;
  }
  switch(iVar3) {
  case 0:
    p->slen = start;
    return;
  case 1:
  case 2:
  case 3:
    doinsert(p,0x3c000000,(finish - start) + 1,start);
    repeat(p,start + 1,1,to);
    doemit(p,0x40000000,p->slen - start);
    if (p->error == 0) {
      p->strip[start] = (ulong)((uint)p->strip[start] & 0x7c000000) | p->slen - start;
    }
    doemit(p,0x44000000,0);
    if (p->error == 0) {
      p->strip[p->slen + -1] = (ulong)((uint)p->strip[p->slen + -1] & 0x7c000000) + 1;
    }
    op = 0x48000000;
    opnd = 2;
    break;
  default:
    p->error = 0xf;
    p->next = nuls;
    p->end = nuls;
    return;
  case 9:
    goto switchD_001068e7_caseD_9;
  case 10:
    doinsert(p,0x3c000000,(finish - start) + 1,start);
    doemit(p,0x40000000,p->slen - start);
    if (p->error == 0) {
      p->strip[start] = (ulong)((uint)p->strip[start] & 0x7c000000) | p->slen - start;
    }
    doemit(p,0x44000000,0);
    if (p->error == 0) {
      p->strip[p->slen + -1] = (ulong)((uint)p->strip[p->slen + -1] & 0x7c000000) + 1;
    }
    doemit(p,0x48000000,2);
    start = dupl(p,start + 1,finish + 1);
    to = to - 1;
    from = 1;
    goto LAB_00106881;
  case 0xb:
    doinsert(p,0x24000000,(finish - start) + 1,start);
    opnd = p->slen - start;
    op = 0x28000000;
    break;
  case 0x12:
    goto switchD_001068e7_caseD_12;
  }
  doemit(p,op,opnd);
  return;
switchD_001068e7_caseD_12:
  start = dupl(p,start,finish);
  from = from - 1;
  to = to - 1;
  goto LAB_00106881;
}

Assistant:

static void
repeat(p, start, from, to)
register struct parse *p;
sopno start;			/* operand from here to end of strip */
int from;			/* repeated from this number */
int to;				/* to this number of times (maybe INFINITY) */
{
	register sopno finish = HERE();
#	define	N	2
#	define	INF	3
#	define	REP(f, t)	((f)*8 + (t))
#	define	MAP(n)	(((n) <= 1) ? (n) : ((n) == INFINITY) ? INF : N)
	register sopno copy;

	if (p->error != 0)	/* head off possible runaway recursion */
		return;

	assert(from <= to);

	switch (REP(MAP(from), MAP(to))) {
	case REP(0, 0):			/* must be user doing this */
		DROP(finish-start);	/* drop the operand */
		break;
	case REP(0, 1):			/* as x{1,1}? */
	case REP(0, N):			/* as x{1,n}? */
	case REP(0, INF):		/* as x{1,}? */
		/* KLUDGE: emit y? as (y|) until subtle bug gets fixed */
		INSERT(OCH_, start);		/* offset is wrong... */
		repeat(p, start+1, 1, to);
		ASTERN(OOR1, start);
		AHEAD(start);			/* ... fix it */
		EMIT(OOR2, 0);
		AHEAD(THERE());
		ASTERN(O_CH, THERETHERE());
		break;
	case REP(1, 1):			/* trivial case */
		/* done */
		break;
	case REP(1, N):			/* as x?x{1,n-1} */
		/* KLUDGE: emit y? as (y|) until subtle bug gets fixed */
		INSERT(OCH_, start);
		ASTERN(OOR1, start);
		AHEAD(start);
		EMIT(OOR2, 0);			/* offset very wrong... */
		AHEAD(THERE());			/* ...so fix it */
		ASTERN(O_CH, THERETHERE());
		copy = dupl(p, start+1, finish+1);
		assert(copy == finish+4);
		repeat(p, copy, 1, to-1);
		break;
	case REP(1, INF):		/* as x+ */
		INSERT(OPLUS_, start);
		ASTERN(O_PLUS, start);
		break;
	case REP(N, N):			/* as xx{m-1,n-1} */
		copy = dupl(p, start, finish);
		repeat(p, copy, from-1, to-1);
		break;
	case REP(N, INF):		/* as xx{n-1,INF} */
		copy = dupl(p, start, finish);
		repeat(p, copy, from-1, to);
		break;
	default:			/* "can't happen" */
		SETERROR(REG_ASSERT);	/* just in case */
		break;
	}
}